

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ps_static.cxx
# Opt level: O0

bool __thiscall xray_re::xr_level_ps_static::save(xr_level_ps_static *this,char *path,char *name)

{
  bool bVar1;
  xr_writer *local_38;
  xr_writer *w;
  xr_file_system *fs;
  char *name_local;
  char *path_local;
  xr_level_ps_static *this_local;
  
  fs = (xr_file_system *)name;
  name_local = path;
  path_local = (char *)this;
  w = (xr_writer *)xr_file_system::instance();
  local_38 = xr_file_system::w_open((xr_file_system *)w,name_local,(char *)fs);
  bVar1 = local_38 != (xr_writer *)0x0;
  if (bVar1) {
    save(this,local_38);
    xr_file_system::w_close((xr_file_system *)w,&local_38);
  }
  return bVar1;
}

Assistant:

bool xr_level_ps_static::save(const char* path, const char* name)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_writer* w = fs.w_open(path, name);
	if (w == 0)
		return false;
	save(*w);
	fs.w_close(w);
	return true;
}